

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

void __thiscall duckdb::UnixFileHandle::~UnixFileHandle(UnixFileHandle *this)

{
  pointer pcVar1;
  
  (this->super_FileHandle)._vptr_FileHandle = (_func_int **)&PTR__UnixFileHandle_02455d08;
  if (this->fd != -1) {
    close(this->fd);
    this->fd = -1;
  }
  (this->super_FileHandle)._vptr_FileHandle = (_func_int **)&PTR__FileHandle_0244f0e0;
  pcVar1 = (this->super_FileHandle).path._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_FileHandle).path.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~UnixFileHandle() override {
		UnixFileHandle::Close();
	}